

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_recs(rf_rec rec1,rf_rec rec2)

{
  undefined1 local_29;
  undefined4 uStack_28;
  float fStack_24;
  _Bool collision;
  rf_rec rec2_local;
  rf_rec rec1_local;
  
  local_29 = false;
  rec2_local.width = rec1.x;
  uStack_28 = rec2.x;
  rec2_local.x = rec2.width;
  if ((((rec2_local.width < uStack_28 + rec2_local.x) &&
       (rec1_local.x = rec1.width, uStack_28 < rec2_local.width + rec1_local.x)) &&
      (rec2_local.height = rec1.y, fStack_24 = rec2.y, rec2_local.y = rec2.height,
      rec2_local.height < fStack_24 + rec2_local.y)) &&
     (rec1_local.y = rec1.height, fStack_24 < rec2_local.height + rec1_local.y)) {
    local_29 = true;
  }
  return local_29;
}

Assistant:

bool rf_check_collision_recs(rf_rec rec1, rf_rec rec2)
{
    bool collision = false;

    if ((rec1.x < (rec2.x + rec2.width) && (rec1.x + rec1.width) > rec2.x) &&
        (rec1.y < (rec2.y + rec2.height) && (rec1.y + rec1.height) > rec2.y))
        collision = true;

    return collision;
}